

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall
GraphTestExplicitImplicit::GraphTestExplicitImplicit(GraphTestExplicitImplicit *this)

{
  GraphTest::GraphTest(&this->super_GraphTest);
  (this->super_GraphTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__GraphTest_001c0238;
  return;
}

Assistant:

TEST_F(GraphTest, ExplicitImplicit) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule catdep\n"
"  depfile = $out.d\n"
"  command = cat $in > $out\n"
"build implicit.h: cat data\n"
"build out.o: catdep foo.cc || implicit.h\n"));
  fs_.Create("implicit.h", "");
  fs_.Create("foo.cc", "");
  fs_.Create("out.o.d", "out.o: implicit.h\n");
  fs_.Create("out.o", "");
  fs_.Tick();
  fs_.Create("data", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out.o"), &err));
  ASSERT_EQ("", err);

  // We have both an implicit and an explicit dep on implicit.h.
  // The implicit dep should "win" (in the sense that it should cause
  // the output to be dirty).
  EXPECT_TRUE(GetNode("out.o")->dirty());
}